

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O3

void __thiscall
dg::pta::PointerAnalysisFI::getMemoryObjects
          (PointerAnalysisFI *this,PSNode *where,Pointer *pointer,
          vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *objects)

{
  pointer *ppuVar1;
  int iVar2;
  ulong uVar3;
  iterator __position;
  iterator __position_00;
  _Rb_tree_header *p_Var4;
  undefined8 *puVar5;
  byte bVar6;
  long lVar7;
  PSNode *pPVar8;
  MemoryObject *mo;
  _Head_base<0UL,_dg::pta::MemoryObject_*,_false> local_20;
  
  pPVar8 = pointer->target;
  iVar2 = *(int *)(pPVar8 + 0x90);
  if (iVar2 == 4) {
LAB_00111518:
    puVar5 = *(undefined8 **)(pPVar8 + 0x58);
  }
  else {
    if (iVar2 != 0x12) {
      if (iVar2 != 6) goto LAB_00111578;
      goto LAB_00111518;
    }
    if ((*(long *)(pPVar8 + 200) == 0) ||
       (uVar3 = *(ulong *)(*(long *)(pPVar8 + 0xc0) + 0x10), (uVar3 & 1) != 0)) {
      lVar7 = 0;
    }
    else {
      lVar7 = 0;
      do {
        if (lVar7 == 0x3f) {
          lVar7 = 0x40;
          break;
        }
        bVar6 = (byte)lVar7;
        lVar7 = lVar7 + 1;
      } while ((uVar3 >> (bVar6 & 0x3f) & 2) == 0);
    }
    puVar5 = (undefined8 *)
             (*(long *)(*(long *)(pPVar8 + 0xc0) + 8) * 0x10 +
              lVar7 * 0x10 + llvm::DisableABIBreakingChecks + -0x10);
  }
  pPVar8 = (PSNode *)*puVar5;
LAB_00111578:
  if (*(int *)(pPVar8 + 0x90) != 7) {
    local_20._M_head_impl = *(MemoryObject **)(pPVar8 + 0x10);
    if (local_20._M_head_impl == (MemoryObject *)0x0) {
      local_20._M_head_impl = (MemoryObject *)operator_new(0x38);
      (local_20._M_head_impl)->node = pPVar8;
      p_Var4 = (_Rb_tree_header *)((long)&((local_20._M_head_impl)->pointsTo)._M_t + 8);
      (((_Rb_tree_header *)((long)&((local_20._M_head_impl)->pointsTo)._M_t + 8))->_M_header).
      _M_color = _S_red;
      *(_Base_ptr *)((long)&((local_20._M_head_impl)->pointsTo)._M_t + 0x10) = (_Base_ptr)0x0;
      *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->pointsTo)._M_t + 0x18) = p_Var4;
      *(_Rb_tree_header **)((long)&((local_20._M_head_impl)->pointsTo)._M_t + 0x20) = p_Var4;
      *(size_t *)((long)&((local_20._M_head_impl)->pointsTo)._M_t + 0x28) = 0;
      __position._M_current =
           (this->memory_objects).
           super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->memory_objects).
          super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::allocator<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>
        ::_M_realloc_insert<dg::pta::MemoryObject*&>
                  ((vector<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::allocator<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>
                    *)&this->memory_objects,__position,&local_20._M_head_impl);
      }
      else {
        ((__position._M_current)->_M_t).
        super___uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>.
        _M_t.
        super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
        .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl = local_20._M_head_impl;
        ppuVar1 = &(this->memory_objects).
                   super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      *(MemoryObject **)&pPVar8[0x10].field_0x0 = local_20._M_head_impl;
    }
    __position_00._M_current = *(MemoryObject ***)(objects + 8);
    if (__position_00._M_current == *(MemoryObject ***)(objects + 0x10)) {
      std::vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>>::
      _M_realloc_insert<dg::pta::MemoryObject*const&>
                ((vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>> *)objects,
                 __position_00,&local_20._M_head_impl);
    }
    else {
      *__position_00._M_current = local_20._M_head_impl;
      *(long *)(objects + 8) = *(long *)(objects + 8) + 8;
    }
  }
  return;
}

Assistant:

void getMemoryObjects(PSNode *where, const Pointer &pointer,
                          std::vector<MemoryObject *> &objects) override {
        // irrelevant in flow-insensitive
        (void) where;
        PSNode *n = pointer.target;

        // we want to have memory in allocation sites
        if (n->getType() == PSNodeType::CAST || n->getType() == PSNodeType::GEP)
            n = n->getOperand(0);
        else if (n->getType() == PSNodeType::CONSTANT) {
            assert(n->pointsTo.size() == 1);
            n = (*n->pointsTo.begin()).target;
        }

        if (n->getType() == PSNodeType::FUNCTION)
            return;

        assert(n->getType() == PSNodeType::ALLOC ||
               n->getType() == PSNodeType::UNKNOWN_MEM);

        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo) {
            mo = new MemoryObject(n);
            memory_objects.emplace_back(mo);
            n->setData<MemoryObject>(mo);
        }

        objects.push_back(mo);
    }